

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

uint __thiscall llvm::APInt::countTrailingOnesSlowCase(APInt *this)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  
  uVar1 = this->BitWidth;
  uVar4 = (ulong)uVar1;
  bVar10 = uVar4 != 0;
  if (uVar4 == 0) {
    uVar6 = 0;
  }
  else {
    if (*(this->U).pVal == 0xffffffffffffffff) {
      uVar7 = (uint)(uVar4 + 0x3f >> 6);
      uVar6 = uVar7 << 6;
      uVar5 = 0;
      lVar9 = 0;
      do {
        if (uVar7 - 1 == (int)lVar9) goto LAB_00144b97;
        uVar5 = uVar5 + 0x40;
        lVar8 = lVar9 + 1;
        lVar2 = lVar9 + 1;
        lVar9 = lVar8;
      } while ((this->U).pVal[lVar2] == 0xffffffffffffffff);
      bVar10 = (uint)lVar8 < uVar7;
      uVar6 = uVar5;
    }
    else {
      lVar8 = 0;
      uVar6 = 0;
    }
    if (bVar10) {
      uVar4 = (this->U).pVal[lVar8] ^ 0xffffffffffffffff;
      if (uVar4 == 0) {
        iVar3 = 0x40;
      }
      else {
        lVar9 = 0;
        if (uVar4 != 0) {
          for (; (uVar4 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        iVar3 = (int)lVar9;
      }
      uVar6 = uVar6 + iVar3;
    }
  }
LAB_00144b97:
  if (uVar1 < uVar6) {
    __assert_fail("Count <= BitWidth",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x24d,"unsigned int llvm::APInt::countTrailingOnesSlowCase() const");
  }
  return uVar6;
}

Assistant:

unsigned APInt::countTrailingOnesSlowCase() const {
  unsigned Count = 0;
  unsigned i = 0;
  for (; i < getNumWords() && U.pVal[i] == WORD_MAX; ++i)
    Count += APINT_BITS_PER_WORD;
  if (i < getNumWords())
    Count += llvm::countTrailingOnes(U.pVal[i]);
  assert(Count <= BitWidth);
  return Count;
}